

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArchiveProxy.cpp
# Opt level: O0

bool __thiscall
aeron::archive::ArchiveProxy::replay
          (ArchiveProxy *this,int64_t recordingId,int64_t position,int64_t length,
          string *replayChannel,int32_t replayStreamId,int64_t correlationId,
          int64_t controlSessionId)

{
  bool bVar1;
  ReplayRequest *pRVar2;
  uint64_t uVar3;
  undefined1 local_70 [8];
  ReplayRequest msg;
  int32_t replayStreamId_local;
  string *replayChannel_local;
  int64_t length_local;
  int64_t position_local;
  int64_t recordingId_local;
  ArchiveProxy *this_local;
  
  msg.m_actingVersion._4_4_ = replayStreamId;
  io::aeron::archive::codecs::ReplayRequest::ReplayRequest((ReplayRequest *)local_70);
  pRVar2 = wrapAndApplyHeader<io::aeron::archive::codecs::ReplayRequest>
                     (this,(ReplayRequest *)local_70);
  pRVar2 = io::aeron::archive::codecs::ReplayRequest::controlSessionId(pRVar2,controlSessionId);
  pRVar2 = io::aeron::archive::codecs::ReplayRequest::correlationId(pRVar2,correlationId);
  pRVar2 = io::aeron::archive::codecs::ReplayRequest::recordingId(pRVar2,recordingId);
  pRVar2 = io::aeron::archive::codecs::ReplayRequest::position(pRVar2,position);
  pRVar2 = io::aeron::archive::codecs::ReplayRequest::length(pRVar2,length);
  pRVar2 = io::aeron::archive::codecs::ReplayRequest::replayStreamId
                     (pRVar2,msg.m_actingVersion._4_4_);
  io::aeron::archive::codecs::ReplayRequest::putReplayChannel(pRVar2,replayChannel);
  uVar3 = io::aeron::archive::codecs::ReplayRequest::encodedLength((ReplayRequest *)local_70);
  bVar1 = offer(this,(int32_t)uVar3);
  return bVar1;
}

Assistant:

bool ArchiveProxy::replay(std::int64_t recordingId, std::int64_t position, std::int64_t length,
                          const std::string& replayChannel, std::int32_t replayStreamId, std::int64_t correlationId,
                          std::int64_t controlSessionId) {
    codecs::ReplayRequest msg;

    wrapAndApplyHeader(msg)
        .controlSessionId(controlSessionId)
        .correlationId(correlationId)
        .recordingId(recordingId)
        .position(position)
        .length(length)
        .replayStreamId(replayStreamId)
        .putReplayChannel(replayChannel);

    return offer(msg.encodedLength());
}